

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O0

void __thiscall boost::system::system_error::system_error(system_error *this,system_error *param_2)

{
  undefined8 uVar1;
  runtime_error *in_RSI;
  runtime_error *in_RDI;
  
  std::runtime_error::runtime_error(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__system_error_0014fa00;
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  *(undefined8 *)(in_RDI + 0x18) = uVar1;
  std::__cxx11::string::string((string *)(in_RDI + 0x20),(string *)(in_RSI + 0x20));
  return;
}

Assistant:

class BOOST_SYMBOL_VISIBLE system_error : public std::runtime_error
    // BOOST_SYMBOL_VISIBLE is needed by GCC to ensure system_error thrown from a shared
    // library can be caught. See svn.boost.org/trac/boost/ticket/3697
    {
    public:
      system_error( error_code ec )
          : std::runtime_error(""), m_error_code(ec) {}

      system_error( error_code ec, const std::string & what_arg )
          : std::runtime_error(what_arg), m_error_code(ec) {}

      system_error( error_code ec, const char* what_arg )
          : std::runtime_error(what_arg), m_error_code(ec) {}

      system_error( int ev, const error_category & ecat )
          : std::runtime_error(""), m_error_code(ev,ecat) {}

      system_error( int ev, const error_category & ecat,
        const std::string & what_arg )
          : std::runtime_error(what_arg), m_error_code(ev,ecat) {}

      system_error( int ev, const error_category & ecat,
        const char * what_arg )
          : std::runtime_error(what_arg), m_error_code(ev,ecat) {}

      virtual ~system_error() BOOST_NOEXCEPT_OR_NOTHROW {}

      const error_code &  code() const BOOST_NOEXCEPT_OR_NOTHROW { return m_error_code; }
      const char *        what() const BOOST_NOEXCEPT_OR_NOTHROW;

    private:
      error_code           m_error_code;
      mutable std::string  m_what;
    }